

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *
__thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
           *__return_storage_ptr__,v10 *this,char **args)

{
  char **args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  return (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *
         )(__return_storage_ptr__->data_).args_[0].field_0.long_long_value;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}